

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelpMessages.cpp
# Opt level: O2

string * ApprovalTests::HelpMessages::getInvalidEnvVarReporterHelp
                   (string *__return_storage_ptr__,string *envVarName,string *selected,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *knowns)

{
  string helpMessage;
  allocator local_49;
  string local_48;
  
  ::std::__cxx11::string::string
            ((string *)&local_48,
             "* The environment variable [envVarName] contains the value\n* [selected]\n*\n* This reporter is recognised, but cannot be found on this machine.\n*\n* Please unset the environment value, or change it to refer to a working\n* reporter:\n*\n[known]*\n* For more information, see:\n* https://github.com/approvals/ApprovalTests.cpp/blob/master/doc/how_tos/SelectReporterWithEnvironmentVariable.md\n"
             ,&local_49);
  envVarErrorMessage(__return_storage_ptr__,envVarName,selected,knowns,&local_48);
  ::std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string
    HelpMessages::getInvalidEnvVarReporterHelp(const std::string& envVarName,
                                               const std::string& selected,
                                               const std::vector<std::string>& knowns)
    {
        std::string helpMessage =
            R"(* The environment variable [envVarName] contains the value
* [selected]
*
* This reporter is recognised, but cannot be found on this machine.
*
* Please unset the environment value, or change it to refer to a working
* reporter:
*
[known]*
* For more information, see:
* https://github.com/approvals/ApprovalTests.cpp/blob/master/doc/how_tos/SelectReporterWithEnvironmentVariable.md
)";

        return envVarErrorMessage(envVarName, selected, knowns, helpMessage);
    }